

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::anon_unknown_26::AssertionPrinter::print(AssertionPrinter *this)

{
  StringRef passOrFail;
  StringRef passOrFail_00;
  StringRef passOrFail_01;
  StringRef passOrFail_02;
  StringRef passOrFail_03;
  StringRef passOrFail_04;
  bool bVar1;
  OfType OVar2;
  size_type in_R9;
  StringRef lhs;
  StringRef rhs;
  StringRef local_118;
  StringRef local_108;
  char *local_f8;
  undefined8 local_f0;
  StringRef local_e8;
  StringRef local_d8;
  char *local_c8;
  undefined8 local_c0;
  char *local_b8;
  undefined8 local_b0;
  char *local_a8;
  undefined8 local_a0;
  char *local_98;
  undefined8 local_90;
  StringRef local_78;
  Catch *local_68;
  char *pcStack_60;
  string local_58;
  StringRef local_38;
  char *local_28;
  undefined8 local_20;
  MessageInfo *local_18;
  AssertionPrinter *local_10;
  AssertionPrinter *this_local;
  
  local_10 = this;
  printSourceInfo(this);
  local_18 = (MessageInfo *)
             std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::begin
                       (this->messages);
  (this->itMessage)._M_current = local_18;
  OVar2 = AssertionResult::getResultType(this->result);
  if (OVar2 != Unknown) {
    if (OVar2 == Ok) {
      local_28 = "passed";
      local_20 = 6;
      passOrFail_04.m_size = 6;
      passOrFail_04.m_start = "passed";
      printResultType(this,BrightGreen,passOrFail_04);
      printOriginalExpression(this);
      printReconstructedExpression(this);
      bVar1 = AssertionResult::hasExpression(this->result);
      if (!bVar1) {
        printRemainingMessages(this,None);
        return;
      }
      printRemainingMessages(this,FileName);
      return;
    }
    if (OVar2 == Info) {
      local_d8 = operator____sr("info",4);
      printResultType(this,None,local_d8);
      printMessage(this);
      printRemainingMessages(this,FileName);
      return;
    }
    if (OVar2 == Warning) {
      local_e8 = operator____sr("warning",7);
      printResultType(this,None,local_e8);
      printMessage(this);
      printRemainingMessages(this,FileName);
      return;
    }
    if (OVar2 == ExplicitSkip) {
      local_108 = operator____sr("skipped",7);
      printResultType(this,FileName,local_108);
      printMessage(this);
      printRemainingMessages(this,FileName);
      return;
    }
    if (OVar2 != FailureBit) {
      if (OVar2 == ExpressionFailed) {
        bVar1 = AssertionResult::isOk(this->result);
        if (bVar1) {
          local_68 = (Catch *)0x416b68;
          pcStack_60 = (char *)0x6;
          local_78 = operator____sr(" - but was ok",0xd);
          lhs.m_size = (size_type)local_78.m_start;
          lhs.m_start = pcStack_60;
          rhs.m_size = in_R9;
          rhs.m_start = (char *)local_78.m_size;
          operator+[abi_cxx11_(&local_58,local_68,lhs,rhs);
          StringRef::StringRef(&local_38,&local_58);
          printResultType(this,BrightGreen,local_38);
          std::__cxx11::string::~string((string *)&local_58);
        }
        else {
          local_98 = "failed";
          local_90 = 6;
          passOrFail_03.m_size = 6;
          passOrFail_03.m_start = "failed";
          printResultType(this,BrightRed,passOrFail_03);
        }
        printOriginalExpression(this);
        printReconstructedExpression(this);
        printRemainingMessages(this,FileName);
        return;
      }
      if (OVar2 == ExplicitFailure) {
        local_f8 = "failed";
        local_f0 = 6;
        passOrFail.m_size = 6;
        passOrFail.m_start = "failed";
        printResultType(this,BrightRed,passOrFail);
        printIssue(this,"explicitly");
        printRemainingMessages(this,None);
        return;
      }
      if (OVar2 != Exception) {
        if (OVar2 == ThrewException) {
          local_a8 = "failed";
          local_a0 = 6;
          passOrFail_02.m_size = 6;
          passOrFail_02.m_start = "failed";
          printResultType(this,BrightRed,passOrFail_02);
          printIssue(this,"unexpected exception with message:");
          printMessage(this);
          printExpressionWas(this);
          printRemainingMessages(this,FileName);
          return;
        }
        if (OVar2 != DidntThrowException) {
          if (OVar2 != FatalErrorCondition) {
            return;
          }
          local_b8 = "failed";
          local_b0 = 6;
          passOrFail_01.m_size = 6;
          passOrFail_01.m_start = "failed";
          printResultType(this,BrightRed,passOrFail_01);
          printIssue(this,"fatal error condition with message:");
          printMessage(this);
          printExpressionWas(this);
          printRemainingMessages(this,FileName);
          return;
        }
        local_c8 = "failed";
        local_c0 = 6;
        passOrFail_00.m_size = 6;
        passOrFail_00.m_start = "failed";
        printResultType(this,BrightRed,passOrFail_00);
        printIssue(this,"expected exception, got none");
        printExpressionWas(this);
        printRemainingMessages(this,FileName);
        return;
      }
    }
  }
  StringRef::StringRef(&local_118,"** internal error **");
  printResultType(this,BrightRed,local_118);
  return;
}

Assistant:

void print() {
        printSourceInfo();

        itMessage = messages.begin();

        switch (result.getResultType()) {
        case ResultWas::Ok:
            printResultType(Colour::ResultSuccess, compactPassedString);
            printOriginalExpression();
            printReconstructedExpression();
            if (!result.hasExpression())
                printRemainingMessages(Colour::None);
            else
                printRemainingMessages();
            break;
        case ResultWas::ExpressionFailed:
            if (result.isOk())
                printResultType(Colour::ResultSuccess, compactFailedString + " - but was ok"_sr);
            else
                printResultType(Colour::Error, compactFailedString);
            printOriginalExpression();
            printReconstructedExpression();
            printRemainingMessages();
            break;
        case ResultWas::ThrewException:
            printResultType(Colour::Error, compactFailedString);
            printIssue("unexpected exception with message:");
            printMessage();
            printExpressionWas();
            printRemainingMessages();
            break;
        case ResultWas::FatalErrorCondition:
            printResultType(Colour::Error, compactFailedString);
            printIssue("fatal error condition with message:");
            printMessage();
            printExpressionWas();
            printRemainingMessages();
            break;
        case ResultWas::DidntThrowException:
            printResultType(Colour::Error, compactFailedString);
            printIssue("expected exception, got none");
            printExpressionWas();
            printRemainingMessages();
            break;
        case ResultWas::Info:
            printResultType(Colour::None, "info"_sr);
            printMessage();
            printRemainingMessages();
            break;
        case ResultWas::Warning:
            printResultType(Colour::None, "warning"_sr);
            printMessage();
            printRemainingMessages();
            break;
        case ResultWas::ExplicitFailure:
            printResultType(Colour::Error, compactFailedString);
            printIssue("explicitly");
            printRemainingMessages(Colour::None);
            break;
        case ResultWas::ExplicitSkip:
            printResultType(Colour::Skip, "skipped"_sr);
            printMessage();
            printRemainingMessages();
            break;
            // These cases are here to prevent compiler warnings
        case ResultWas::Unknown:
        case ResultWas::FailureBit:
        case ResultWas::Exception:
            printResultType(Colour::Error, "** internal error **");
            break;
        }
    }